

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_224a1::
ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_emptyTreeSeek_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *tree;
  char *in_R9;
  key_view kVar1;
  bool match;
  iterator e;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  bool local_6b1;
  AssertHelper local_6b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_6a8;
  internal local_6a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_698;
  string local_690;
  iterator local_670;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(&local_500,false);
  tree = &local_500.test_db;
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator(&local_670,tree);
  local_6b1 = false;
  kVar1 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,0);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek(&local_670,(art_key_type)kVar1,&local_6b1,true);
  local_6a0[0] = (internal)
                 (local_670.stack_.c.
                  super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_670.stack_.c.
                 super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_6a0[0]) {
    testing::Message::Message((Message *)&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_690,local_6a0,(AssertionResult *)"e.valid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x128,local_690._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if (local_6a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a8._M_head_impl + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  local_6a0[0] = (internal)(local_6b1 ^ 1);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_6b1 != false) {
    testing::Message::Message((Message *)&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_690,local_6a0,(AssertionResult *)0x21b7a9,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x129,local_690._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if (local_6a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a8._M_head_impl + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  if (0x100 < local_670.keybuf_.cap) {
    free(local_670.keybuf_.buf);
  }
  std::
  _Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  ::~_Deque_base((_Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  *)&local_670.stack_);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::iterator(&local_670,tree);
  local_6b1 = false;
  kVar1 = unodb::test::
          tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
          ::make_key(&local_500,0);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::seek(&local_670,(art_key_type)kVar1,&local_6b1,false);
  local_6a0[0] = (internal)
                 (local_670.stack_.c.
                  super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                 local_670.stack_.c.
                 super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_6a0[0]) {
    testing::Message::Message((Message *)&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_690,local_6a0,(AssertionResult *)"e.valid()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x130,local_690._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if (local_6a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a8._M_head_impl + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  local_6a0[0] = (internal)(local_6b1 ^ 1);
  local_698 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_6b1 != false) {
    testing::Message::Message((Message *)&local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_690,local_6a0,(AssertionResult *)0x21b7a9,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x131,local_690._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_6b0,(Message *)&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    if (local_6a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_6a8._M_head_impl + 8))();
    }
    if (local_698 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_698,local_698);
    }
  }
  if (0x100 < local_670.keybuf_.cap) {
    free(local_670.keybuf_.buf);
  }
  std::
  _Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
  ::~_Deque_base((_Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                  *)&local_670.stack_);
  if (local_500.key_views.
      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_500.key_views.
                    super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_500.key_views.
                          super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ::~_Rb_tree(&local_500.values._M_t);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::~olc_db(tree);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}